

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,CaseStatement *stmt)

{
  pointer *this_00;
  Expression *this_01;
  bool bVar1;
  iterator pIVar2;
  size_type __n;
  iterator ppEVar3;
  iterator iVar4;
  iterator iVar5;
  char *pcVar6;
  Statement *stmt_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  string_view sep;
  format_args args_00;
  format_args args_01;
  string_view sep_00;
  format_args args_02;
  join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
  local_938;
  v9 *local_918;
  char *local_910;
  string local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8e8 [2];
  string local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
  local_878;
  v9 *local_858;
  char *local_850;
  string local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_828 [2];
  string local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_7b8;
  SourceLocation local_798;
  undefined1 local_790 [8];
  ExpressionPrinter p_1;
  Expression *e;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_str;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> values;
  ItemGroup *case_;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_conditions;
  SourceLocation local_548;
  undefined1 local_540 [8];
  ExpressionPrinter p;
  string target_str;
  Expression *target;
  CaseStatement *stmt_local;
  Serializer *this_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  *local_358 [2];
  undefined1 local_348 [16];
  v9 *local_338;
  char *local_330;
  join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
  *local_328;
  v9 *local_320;
  char *pcStack_318;
  string *local_310;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  *local_308 [3];
  undefined1 local_2f0 [16];
  v9 *local_2e0;
  char *local_2d8;
  join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
  *local_2d0;
  v9 *local_2c8;
  char *pcStack_2c0;
  string *local_2b8;
  v9 **local_2b0;
  v9 *local_2a8;
  char *pcStack_2a0;
  v9 **local_290;
  v9 *local_288;
  char *pcStack_280;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_278;
  undefined1 *local_270;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_268;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_260;
  undefined8 local_258;
  undefined1 *local_250;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_248;
  undefined1 *local_240;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_238;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  **local_230;
  undefined8 local_228;
  undefined1 *local_220;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  char *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  char *pcStack_1b8;
  string *local_1b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  undefined1 local_188 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  char *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  undefined1 *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  char *pcStack_150;
  string *local_148;
  char *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_138;
  char *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_128;
  char *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_118;
  char *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_108;
  char *local_100;
  v9 **local_f8;
  char *local_f0;
  v9 **local_e8;
  char *local_e0;
  v9 **local_d8;
  char *local_d0;
  v9 **local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  char *pcStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  undefined8 local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  this_01 = stmt->expr;
  std::__cxx11::string::string((string *)&p.field_0x188);
  local_548 = slang::SourceRange::start(&this_01->sourceRange);
  ExpressionPrinter::ExpressionPrinter((ExpressionPrinter *)local_540,&local_548);
  slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>
            (this_01,(ExpressionPrinter *)local_540);
  ExpressionPrinter::str_abi_cxx11_
            ((string *)
             &all_conditions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ExpressionPrinter *)local_540);
  std::__cxx11::string::operator=
            ((string *)&p.field_0x188,
             (string *)
             &all_conditions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &all_conditions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ExpressionPrinter::~ExpressionPrinter((ExpressionPrinter *)local_540);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  __end2 = nonstd::span_lite::
           span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                     (&stmt->items);
  pIVar2 = nonstd::span_lite::
           span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                     (&stmt->items);
  for (; __end2 != pIVar2; __end2 = __end2 + 1) {
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(__end2->expressions).data_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    __n = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     &values_str.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3,__n);
    this_00 = &values_str.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this_00);
    ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              end((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this_00);
    for (; __end3 != ppEVar3; __end3 = __end3 + 1) {
      p_1._392_8_ = *__end3;
      if ((Expression *)p_1._392_8_ != (Expression *)0x0) {
        local_798 = slang::SourceRange::start(&((Expression *)p_1._392_8_)->sourceRange);
        ExpressionPrinter::ExpressionPrinter((ExpressionPrinter *)local_790,&local_798);
        slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>
                  ((Expression *)p_1._392_8_,(ExpressionPrinter *)local_790);
        ExpressionPrinter::str_abi_cxx11_(&local_7b8,(ExpressionPrinter *)local_790);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range3,
                   &local_7b8);
        std::__cxx11::string::~string((string *)&local_7b8);
        if (stmt->defaultCase != (Statement *)0x0) {
          ExpressionPrinter::str_abi_cxx11_((string *)&__range3_1,(ExpressionPrinter *)local_790);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range3_1);
          std::__cxx11::string::~string((string *)&__range3_1);
        }
        ExpressionPrinter::~ExpressionPrinter((ExpressionPrinter *)local_790);
      }
    }
    __end3_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&s);
      if (!bVar1) break;
      local_7f8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3_1);
      local_138 = local_828;
      local_140 = "({0} == {1})";
      local_130 = "({0} == {1})";
      local_828[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6d50b8;
      local_128 = local_138;
      local_170 = (char *)std::char_traits<char>::length("({0} == {1})");
      local_20 = local_140;
      local_148 = &local_818;
      local_158 = local_828[0];
      local_160 = &p.field_0x188;
      local_168 = local_7f8;
      local_c0 = &local_158;
      local_178 = local_828[0];
      pcStack_150 = local_170;
      local_b8 = local_178;
      pcStack_b0 = local_170;
      ::fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
                (&local_1a8,(v9 *)local_160,local_7f8,local_828[0]);
      local_80 = local_188;
      local_88 = &local_1a8;
      local_70 = 0xdd;
      fmt.size_ = 0xdd;
      fmt.data_ = local_170;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_88;
      local_78 = local_88;
      local_68 = local_80;
      local_30 = local_88;
      ::fmt::v9::vformat_abi_cxx11_(&local_818,(v9 *)local_178,fmt,args);
      std::__cxx11::string::operator=((string *)local_7f8,(string *)&local_818);
      std::__cxx11::string::~string((string *)&local_818);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3_1);
    }
    local_f8 = &local_858;
    local_100 = "{0}";
    local_f0 = "{0}";
    local_858 = (v9 *)0x6d4945;
    local_e8 = local_f8;
    local_850 = (char *)std::char_traits<char>::length("{0}");
    local_10 = local_100;
    iVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
    iVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
    pcVar6 = (char *)std::char_traits<char>::length(" && ");
    sep.size_ = (size_t)in_R9.values_;
    sep.data_ = pcVar6;
    ::fmt::v9::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_878,(v9 *)iVar4._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar5._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )0x6d490a,sep);
    local_2b8 = &local_848;
    local_2c8 = local_858;
    pcStack_2c0 = local_850;
    local_2d0 = &local_878;
    local_2b0 = &local_2c8;
    local_2e0 = local_858;
    local_2d8 = local_850;
    local_2a8 = local_2e0;
    pcStack_2a0 = local_2d8;
    local_308[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
                               *)local_2d0,(v9 *)iVar4._M_current,
                              (join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
                               *)local_2b8);
    local_270 = local_2f0;
    local_278 = local_308;
    local_258 = 0xf;
    fmt_00.size_ = 0xf;
    fmt_00.data_ = local_2d8;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_278;
    local_268 = local_278;
    local_260 = local_278;
    local_250 = local_270;
    ::fmt::v9::vformat_abi_cxx11_(&local_848,local_2e0,fmt_00,args_00);
    std::__cxx11::string::operator=((string *)&this->current_condition_,(string *)&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    stmt_00 = slang::not_null::operator_cast_to_Statement_((not_null *)&__end2->stmt);
    visit_block_stmt(this,stmt_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
  }
  if (stmt->defaultCase != (Statement *)0x0) {
    __end3_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
    s_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_2,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&s_1);
      if (!bVar1) break;
      local_8b8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3_2);
      local_118 = local_8e8;
      local_120 = "({0} != {1})";
      local_110 = "({0} != {1})";
      local_8e8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6d50c5;
      local_108 = local_118;
      local_1d8 = (char *)std::char_traits<char>::length("({0} != {1})");
      local_28 = local_120;
      local_1b0 = &local_8d8;
      local_1c0 = local_8e8[0];
      local_1c8 = &p.field_0x188;
      local_1d0 = local_8b8;
      local_a0 = &local_1c0;
      local_1e0 = local_8e8[0];
      pcStack_1b8 = local_1d8;
      local_98 = local_1e0;
      pcStack_90 = local_1d8;
      ::fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
                (&local_218,(v9 *)local_1c8,local_8b8,local_8e8[0]);
      local_58 = local_1f0;
      local_60 = &local_218;
      local_48 = 0xdd;
      fmt_01.size_ = 0xdd;
      fmt_01.data_ = local_1d8;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_60;
      local_50 = local_60;
      local_40 = local_58;
      local_38 = local_60;
      ::fmt::v9::vformat_abi_cxx11_(&local_8d8,(v9 *)local_1e0,fmt_01,args_01);
      std::__cxx11::string::operator=((string *)local_8b8,(string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8d8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3_2);
    }
    local_d8 = &local_918;
    local_e0 = "{0}";
    local_d0 = "{0}";
    local_918 = (v9 *)0x6d4945;
    local_c8 = local_d8;
    local_910 = (char *)std::char_traits<char>::length("{0}");
    local_18 = local_e0;
    iVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    iVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2);
    pcVar6 = (char *)std::char_traits<char>::length(" && ");
    sep_00.size_ = (size_t)in_R9.values_;
    sep_00.data_ = pcVar6;
    ::fmt::v9::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_938,(v9 *)iVar4._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar5._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )0x6d490a,sep_00);
    local_310 = &local_908;
    local_320 = local_918;
    pcStack_318 = local_910;
    local_328 = &local_938;
    local_290 = &local_320;
    local_338 = local_918;
    local_330 = local_910;
    local_288 = local_338;
    pcStack_280 = local_330;
    local_358[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
                               *)local_328,(v9 *)iVar4._M_current,
                              (join_view<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
                               *)local_310);
    local_240 = local_348;
    local_248 = local_358;
    local_228 = 0xf;
    fmt_02.size_ = 0xf;
    fmt_02.data_ = local_330;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_248;
    local_238 = local_248;
    local_230 = local_248;
    local_220 = local_240;
    ::fmt::v9::vformat_abi_cxx11_(&local_908,local_338,fmt_02,args_02);
    std::__cxx11::string::operator=((string *)&this->current_condition_,(string *)&local_908);
    std::__cxx11::string::~string((string *)&local_908);
    visit_block_stmt(this,stmt->defaultCase);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  std::__cxx11::string::~string((string *)&p.field_0x188);
  return;
}

Assistant:

void handle(const slang::ast::CaseStatement &stmt) {
        auto const &target = stmt.expr;
        std::string target_str;
        {
            ExpressionPrinter p(target.sourceRange.start());
            target.visit(p);
            target_str = p.str();
        }

        std::vector<std::string> all_conditions;

        for (auto const &case_ : stmt.items) {
            auto values = case_.expressions;
            std::vector<std::string> values_str;
            values_str.reserve(values.size());
            for (auto *e : values) {
                if (e) {
                    ExpressionPrinter p(e->sourceRange.start());
                    e->visit(p);
                    values_str.emplace_back(p.str());
                    if (stmt.defaultCase) {
                        all_conditions.emplace_back(p.str());
                    }
                }
            }
            for (auto &s : values_str) {
                s = fmt::format("({0} == {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(values_str.begin(), values_str.end(), " && "));
            visit_block_stmt(case_.stmt);
        }

        if (stmt.defaultCase) {
            for (auto &s : all_conditions) {
                s = fmt::format("({0} != {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(all_conditions.begin(), all_conditions.end(), " && "));
            visit_block_stmt(stmt.defaultCase);
        }
    }